

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O2

void __thiscall xray_re::cse_shape::cform_read(cse_shape *this,xr_packet *packet)

{
  pointer psVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  shape_def local_78;
  
  psVar1 = (this->m_shapes).
           super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_shapes).super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>.
      _M_impl.super__Vector_impl_data._M_finish != psVar1) {
    (this->m_shapes).super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>.
    _M_impl.super__Vector_impl_data._M_finish = psVar1;
  }
  bVar2 = xr_packet::r<unsigned_char>(packet);
  uVar3 = (ulong)bVar2;
  while( true ) {
    while( true ) {
      bVar4 = uVar3 == 0;
      uVar3 = uVar3 - 1;
      if (bVar4) {
        return;
      }
      local_78.field_1._44_8_ = 0;
      local_78.field_1._52_8_ = 0;
      local_78.field_1._28_8_ = 0;
      local_78.field_1._36_8_ = 0;
      local_78.field_1._12_8_ = 0;
      local_78.field_1._20_8_ = 0;
      local_78._0_8_ = 0;
      local_78.field_1._4_8_ = 0;
      local_78.field_1._60_4_ = 0;
      std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>::
      emplace_back<xray_re::shape_def>(&this->m_shapes,&local_78);
      psVar1 = (this->m_shapes).
               super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl.
               super__Vector_impl_data._M_finish;
      xr_packet::r<unsigned_char>(packet,&psVar1[-1].type);
      if (psVar1[-1].type != '\x01') break;
      xr_packet::r_matrix(packet,&psVar1[-1].field_1.box);
    }
    if (psVar1[-1].type != '\0') break;
    xr_packet::r<xray_re::_vector3<float>>(packet,&psVar1[-1].field_1.sphere.p);
    xr_packet::r<float>(packet,&psVar1[-1].field_1.sphere.r);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity.cxx"
                ,0x54,"void xray_re::cse_shape::cform_read(xr_packet &)");
}

Assistant:

void cse_shape::cform_read(xr_packet& packet)
{
	m_shapes.clear();
	for (uint_fast32_t n = packet.r_u8(); n; --n) {
		m_shapes.push_back(shape_def());
		shape_def& def = m_shapes.back();
		packet.r_u8(def.type);
		if (def.type == SHAPE_SPHERE) {
			packet.r_vec3(def.sphere.p);
			packet.r_float(def.sphere.r);
		} else if (def.type == SHAPE_BOX) {
			packet.r_matrix(def.box);
		} else {
			xr_not_expected();
		}
	}
}